

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetEscapedFormattedValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  bool bVar5;
  char *pcVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  TemplateDictionaryPeer peer;
  TemplateString local_140;
  TemplateString local_120;
  TemplateString local_100;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_140,"test_SetEscapedFormattedValue");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_140,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_a0,"HTML");
  TVar1.length_._0_4_ = (int)local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.length_._4_4_ = (int)(local_a0.length_ >> 0x20);
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_3_ = local_a0._17_3_;
  TVar1._20_4_ = local_a0._20_4_;
  TVar1.id_._0_4_ = (undefined4)local_a0.id_;
  TVar1.id_._4_4_ = local_a0.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar1,(TemplateModifier *)&dict,(char *)&ctemplate::html_escape,0x55555555,
             "This is <%s> #%.4f","a & b",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_c0,"PRE");
  TVar2.length_._0_4_ = (int)local_c0.length_;
  TVar2.ptr_ = local_c0.ptr_;
  TVar2.length_._4_4_ = (int)(local_c0.length_ >> 0x20);
  TVar2.is_immutable_ = local_c0.is_immutable_;
  TVar2._17_3_ = local_c0._17_3_;
  TVar2._20_4_ = local_c0._20_4_;
  TVar2.id_._0_4_ = (undefined4)local_c0.id_;
  TVar2.id_._4_4_ = local_c0.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar2,(TemplateModifier *)&dict,(char *)&ctemplate::pre_escape,0x55555555,
             "if %s x = %.4f;","(a < 1 && b > 2)\n\t",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_e0,"URL");
  TVar3.ptr_._4_4_ = local_e0.ptr_._4_4_;
  TVar3.ptr_._0_4_ = local_e0.ptr_._0_4_;
  TVar3.length_._0_4_ = (undefined4)local_e0.length_;
  TVar3.length_._4_4_ = local_e0.length_._4_4_;
  TVar3.is_immutable_ = local_e0.is_immutable_;
  TVar3._17_3_ = local_e0._17_3_;
  TVar3._20_4_ = local_e0._20_4_;
  TVar3.id_._0_4_ = (undefined4)local_e0.id_;
  TVar3.id_._4_4_ = local_e0.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar3,(TemplateModifier *)&dict,(char *)&ctemplate::url_query_escape,"pageviews-%s",
             "r?egex",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_100,"XML");
  TVar4.ptr_._4_4_ = local_100.ptr_._4_4_;
  TVar4.ptr_._0_4_ = local_100.ptr_._0_4_;
  TVar4.length_._0_4_ = (undefined4)local_100.length_;
  TVar4.length_._4_4_ = local_100.length_._4_4_;
  TVar4.is_immutable_ = local_100.is_immutable_;
  TVar4._17_3_ = local_100._17_3_;
  TVar4._20_4_ = local_100._20_4_;
  TVar4.id_._0_4_ = (undefined4)local_100.id_;
  TVar4.id_._4_4_ = local_100.id_._4_4_;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar4,(TemplateModifier *)&dict,(char *)&ctemplate::xml_escape,"This&is%s -- ok?",
             "just&",in_R8,in_R9);
  ctemplate::TemplateString::TemplateString(&local_140,"HTML");
  ctemplate::TemplateString::TemplateString(&local_120,"This is &lt;a &amp; b&gt; #0.3333");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_140,&local_120);
  if (bVar5) {
    ctemplate::TemplateString::TemplateString(&local_140,"PRE");
    ctemplate::TemplateString::TemplateString
              (&local_120,"if (a &lt; 1 &amp;&amp; b &gt; 2)\n\t x = 0.3333;");
    bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_140,&local_120);
    if (bVar5) {
      ctemplate::TemplateString::TemplateString(&local_140,"URL");
      ctemplate::TemplateString::TemplateString(&local_120,"pageviews-r%3Fegex");
      bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_140,&local_120);
      if (bVar5) {
        ctemplate::TemplateString::TemplateString(&local_140,"XML");
        ctemplate::TemplateString::TemplateString(&local_120,"This&amp;isjust&amp; -- ok?");
        bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_140,&local_120);
        if (bVar5) {
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        pcVar6 = "peer.ValueIs(\"XML\", \"This&amp;isjust&amp; -- ok?\")";
      }
      else {
        pcVar6 = "peer.ValueIs(\"URL\", \"pageviews-r%3Fegex\")";
      }
    }
    else {
      pcVar6 = "peer.ValueIs(\"PRE\", \"if (a &lt; 1 &amp;&amp; b &gt; 2)\\n\\t x = 0.3333;\")";
    }
  }
  else {
    pcVar6 = "peer.ValueIs(\"HTML\", \"This is &lt;a &amp; b&gt; #0.3333\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar6);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetEscapedFormattedValue) {
  TemplateDictionary dict("test_SetEscapedFormattedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetEscapedFormattedValue("HTML", GOOGLE_NAMESPACE::html_escape,
                                "This is <%s> #%.4f", "a & b", 1.0/3);
  dict.SetEscapedFormattedValue("PRE", GOOGLE_NAMESPACE::pre_escape,
                                "if %s x = %.4f;", "(a < 1 && b > 2)\n\t", 1.0/3);
  dict.SetEscapedFormattedValue("URL", GOOGLE_NAMESPACE::url_query_escape,
                                "pageviews-%s", "r?egex");
  dict.SetEscapedFormattedValue("XML", GOOGLE_NAMESPACE::xml_escape,
                                "This&is%s -- ok?", "just&");

  EXPECT_TRUE(peer.ValueIs("HTML",
                           "This is &lt;a &amp; b&gt; #0.3333"));
  EXPECT_TRUE(peer.ValueIs("PRE",
                           "if (a &lt; 1 &amp;&amp; b &gt; 2)\n\t x = 0.3333;"));
  EXPECT_TRUE(peer.ValueIs("URL", "pageviews-r%3Fegex"));

  EXPECT_TRUE(peer.ValueIs("XML", "This&amp;isjust&amp; -- ok?"));
}